

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.cpp
# Opt level: O0

void __thiscall boozd::azzio::io_context::run(io_context *this)

{
  time_point this_00;
  bool bVar1;
  tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&> *__t;
  stream *psVar2;
  rep rVar3;
  undefined4 extraout_var;
  int *__args;
  function<void_(boozd::azzio::io_context::error_code)> *this_01;
  int local_5c;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  _Optional_payload_base<int> local_50;
  optional<int> read;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point start;
  vector<int,_std::allocator<int>_> *b;
  stream *s;
  io_context *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)this);
  if ((bVar1) &&
     (bVar1 = std::optional::operator_cast_to_bool((optional *)&this->_handler_optional), bVar1)) {
    __t = std::
          optional<std::tuple<boozd::azzio::stream_&,_std::vector<int,_std::allocator<int>_>_&>_>::
          operator*(&this->_pack_optional);
    psVar2 = std::get<0ul,boozd::azzio::stream&,std::vector<int,std::allocator<int>>&>(__t);
    start.__d.__r =
         (duration)std::get<1ul,boozd::azzio::stream&,std::vector<int,std::allocator<int>>&>(__t);
    local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    while( true ) {
      read.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)std::chrono::_V2::steady_clock::now();
      local_40.__r = (rep)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&read,&local_30);
      local_38.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_40);
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
      if (999 < rVar3) break;
      local_50._M_payload._M_value = (*psVar2->_vptr_stream[2])();
      local_50._4_4_ = extraout_var;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
      this_00 = start;
      if (bVar1) {
        __args = std::optional<int>::operator*((optional<int> *)&local_50);
        std::vector<int,std::allocator<int>>::emplace_back<int&>
                  ((vector<int,std::allocator<int>> *)this_00.__d.__r,__args);
      }
      local_5c = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_58,&local_5c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
    }
    this_01 = std::optional<std::function<void_(boozd::azzio::io_context::error_code)>_>::operator*
                        (&this->_handler_optional);
    std::function<void_(boozd::azzio::io_context::error_code)>::operator()(this_01,no_error);
  }
  return;
}

Assistant:

void io_context::run()
{
    if (_pack_optional && _handler_optional) {
        auto& [s, b] = *_pack_optional;
        using namespace std::chrono;
        auto start = steady_clock::now();
        while (duration_cast<milliseconds>(steady_clock::now() - start).count() < 1000) {
            if (auto read = s.read())
                b.emplace_back(*read);
            std::this_thread::sleep_for(milliseconds(100));
        }

        (*_handler_optional)(error_code::no_error);
    }
}